

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

uint32_t LogLuv24fromXYZ(float *XYZ,int em)

{
  int iVar1;
  uint uVar2;
  double u;
  double dVar3;
  
  iVar1 = LogL10fromY((double)XYZ[1],em);
  dVar3 = (double)XYZ[2] * 3.0 + (double)XYZ[1] * 15.0 + (double)*XYZ;
  if (dVar3 <= 0.0 || iVar1 == 0) {
    u = 0.210526316;
    dVar3 = 0.473684211;
  }
  else {
    u = ((double)*XYZ * 4.0) / dVar3;
    dVar3 = ((double)XYZ[1] * 9.0) / dVar3;
  }
  uVar2 = uv_encode(u,dVar3,em);
  if ((int)uVar2 < 0) {
    uVar2 = uv_encode(0.210526316,0.473684211,0);
  }
  return iVar1 << 0xe | uVar2;
}

Assistant:

uint32_t
    LogLuv24fromXYZ(float *XYZ, int em)
{
    int Le, Ce;
    double u, v, s;
    /* encode luminance */
    Le = LogL10fromY(XYZ[1], em);
    /* encode color */
    s = XYZ[0] + 15. * XYZ[1] + 3. * XYZ[2];
    if (!Le || s <= 0.)
    {
        u = U_NEU;
        v = V_NEU;
    }
    else
    {
        u = 4. * XYZ[0] / s;
        v = 9. * XYZ[1] / s;
    }
    Ce = uv_encode(u, v, em);
    if (Ce < 0) /* never happens */
        Ce = uv_encode(U_NEU, V_NEU, SGILOGENCODE_NODITHER);
    /* combine encodings */
    return (Le << 14 | Ce);
}